

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::fresnel::schlick::eval(schlick *this,float_t zd)

{
  bool bVar1;
  float *extraout_RDX;
  long in_RSI;
  value_type vVar2;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>,_float>
  _Var3;
  value_type local_74;
  _Expr<std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>,_float>
  local_70;
  _Expr<std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>,_float>
  local_60;
  _Expr<std::__detail::_BinClos<std::__plus,_std::_ValArray,_std::_Expr,_float,_std::__detail::_BinClos<std::__multiplies,_std::_Constant,_std::_Expr,_float,_std::__detail::_BinClos<std::__minus,_std::_Constant,_std::_ValArray,_float,_float>_>_>,_float>
  local_48;
  float local_28;
  float local_24;
  float_t c5;
  float_t c2;
  float_t c1;
  float_t zd_local;
  schlick *this_local;
  
  bVar1 = false;
  if ((0.0 <= zd) && (bVar1 = false, zd <= 1.0)) {
    bVar1 = true;
  }
  c2 = zd;
  this_local = this;
  if (!bVar1) {
    __assert_fail("zd >= 0 && zd <= 1 && \"Invalid Angle\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x483,"virtual brdf::value_type djb::fresnel::schlick::eval(float_t) const");
  }
  c5 = 1.0 - zd;
  local_24 = c5 * c5;
  local_28 = local_24 * local_24 * c5;
  local_74 = 1.0;
  _Var3 = std::operator-(&local_74,(valarray<float> *)(in_RSI + 8));
  local_70._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr2 =
       _Var3._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr2;
  local_70._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr1 =
       _Var3._M_closure.super__BinBase1<std::__minus,_std::valarray<float>_>._M_expr1;
  std::operator*(&local_60,&local_28,&local_70);
  std::operator+(&local_48,(valarray<float> *)(in_RSI + 8),&local_60);
  std::valarray<float>::
  valarray<std::__detail::_BinClos<std::__plus,std::_ValArray,std::_Expr,float,std::__detail::_BinClos<std::__multiplies,std::_Constant,std::_Expr,float,std::__detail::_BinClos<std::__minus,std::_Constant,std::_ValArray,float,float>>>>
            ((valarray<float> *)this,&local_48);
  vVar2._M_data = extraout_RDX;
  vVar2._M_size = (size_t)this;
  return vVar2;
}

Assistant:

brdf::value_type schlick::eval(float_t zd) const
{
	DJB_ASSERT(zd >= 0 && zd <= 1 && "Invalid Angle");
	float_t c1 = 1 - zd;
	float_t c2 = c1 * c1;
	float_t c5 = c2 * c2 * c1;

	return f0 + c5 * ((float_t)1 - f0);
}